

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcLightSource::~IfcLightSource(IfcLightSource *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].Intensity.have = 0x946b80;
  (this->AmbientIntensity).ptr = 4.80576072699714e-317;
  *(undefined8 *)&this[-1].field_0x88 = 0x946ba8;
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x946bd0;
  puVar1 = *(undefined1 **)
            &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10;
  if (puVar1 != &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20)
  {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].Intensity.have);
  return;
}

Assistant:

IfcLightSource() : Object("IfcLightSource") {}